

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_parser_t * mpc_real(void)

{
  mpc_parser_t *pmVar1;
  void *pvVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  void *pvVar5;
  void *pvVar6;
  
  pmVar1 = mpc_oneof("+-");
  pvVar2 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar2 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar2 + 8) = pmVar1;
  *(code **)((long)pvVar2 + 0x18) = mpcf_ctor_str;
  pmVar1 = mpc_digits();
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\t';
  (pmVar3->data).range.x = '.';
  pmVar3 = mpc_expectf(pmVar3,"\'%c\'",0x2e);
  pmVar4 = mpc_digits();
  pmVar3 = mpc_and(2,mpcf_strfold,pmVar3,pmVar4,free);
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar5 + 8) = pmVar3;
  *(code **)((long)pvVar5 + 0x18) = mpcf_ctor_str;
  pmVar3 = mpc_oneof("eE");
  pmVar4 = mpc_oneof("+-");
  pvVar6 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar6 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar6 + 8) = pmVar4;
  *(code **)((long)pvVar6 + 0x18) = mpcf_ctor_str;
  pmVar4 = mpc_digits();
  pmVar3 = mpc_and(3,mpcf_strfold,pmVar3,pvVar6,pmVar4,free,free);
  pvVar6 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar6 + 0x30) = 0x13;
  *(mpc_parser_t **)((long)pvVar6 + 8) = pmVar3;
  *(code **)((long)pvVar6 + 0x18) = mpcf_ctor_str;
  pmVar1 = mpc_and(4,mpcf_strfold,pvVar2,pmVar1,pvVar5,pvVar6,free,free,free);
  pmVar1 = mpc_expect(pmVar1,"real");
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_real(void) {

  /* [+-]?\d+(\.\d+)?([eE][+-]?[0-9]+)? */

  mpc_parser_t *p0, *p1, *p2, *p30, *p31, *p32, *p3;

  p0 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p1 = mpc_digits();
  p2 = mpc_maybe_lift(mpc_and(2, mpcf_strfold, mpc_char('.'), mpc_digits(), free), mpcf_ctor_str);
  p30 = mpc_oneof("eE");
  p31 = mpc_maybe_lift(mpc_oneof("+-"), mpcf_ctor_str);
  p32 = mpc_digits();
  p3 = mpc_maybe_lift(mpc_and(3, mpcf_strfold, p30, p31, p32, free, free), mpcf_ctor_str);

  return mpc_expect(mpc_and(4, mpcf_strfold, p0, p1, p2, p3, free, free, free), "real");

}